

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentHandlers.cpp
# Opt level: O0

error_t ArgumentHandlers::modelOptions_parse_argument(int key,char *arg,argp_state *state)

{
  long lVar1;
  long in_RDX;
  char *in_RSI;
  int in_EDI;
  float fVar2;
  Arguments *theArgumentsStruc;
  
  lVar1 = *(long *)(in_RDX + 0x28);
  if (in_EDI == 1) {
    *(undefined4 *)(lVar1 + 0x6c) = 1;
  }
  else if (in_EDI == 0x66) {
    *(undefined1 *)(lVar1 + 0x65) = 1;
  }
  else if (in_EDI == 0x67) {
    fVar2 = strtof(in_RSI,(char **)0x0);
    *(double *)(lVar1 + 0x70) = (double)fVar2;
  }
  else {
    if (in_EDI != 0x73) {
      return 7;
    }
    *(undefined4 *)(lVar1 + 0x68) = 1;
  }
  return 0;
}

Assistant:

error_t
modelOptions_parse_argument (int key, char *arg, struct argp_state *state)
{
    /* Get the input argument from argp_parse, which we
      know is a pointer to our arguments structure. */
    struct Arguments *theArgumentsStruc = (struct Arguments*) state->input;

    switch (key)
    {
        case 'f': 
            theArgumentsStruc->cache_flat_models = true;
            break;
        case 's': 
            theArgumentsStruc->sparse = 1;
            break;
        case OPT_TOI:
            theArgumentsStruc->isTOI=1;
            break;
        case 'g':
            theArgumentsStruc->discount = strtof(arg,0);
            break;
        default:
            return ARGP_ERR_UNKNOWN;
     }
    return 0;
}